

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O2

c_v64 c_v64_shr_u32(c_v64 a,uint n)

{
  c_v64 cVar1;
  
  if (n < 0x20) {
    cVar1._0_4_ = a.u32[0] >> ((byte)n & 0x1f);
    cVar1.u32[1] = a.u32[1] >> ((byte)n & 0x1f);
    return (c_v64)cVar1.u64;
  }
  fprintf(_stderr,"Error: undefined u32 shift right %d\n",(ulong)n);
  abort();
}

Assistant:

SIMD_INLINE c_v64 c_v64_shr_u32(c_v64 a, unsigned int n) {
  c_v64 t;
  if (SIMD_CHECK && n > 31) {
    fprintf(stderr, "Error: undefined u32 shift right %d\n", n);
    abort();
  }
  t.u32[1] = a.u32[1] >> n;
  t.u32[0] = a.u32[0] >> n;
  return t;
}